

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86_avx512::create_pipeline_int8_x86(Convolution_x86_avx512 *this,Option *opt)

{
  float fVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  float *pfVar8;
  int *piVar9;
  Allocator *pAVar10;
  int max_kk;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  bool bVar13;
  int k;
  uint _h;
  int iVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  short *psVar20;
  long lVar21;
  ulong uVar22;
  undefined8 uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  int iVar29;
  int k_00;
  ulong uVar30;
  long lVar31;
  short *psVar32;
  int k_1;
  size_t sVar33;
  int kk;
  ulong uVar34;
  long lVar35;
  char *pcVar36;
  void *pvVar37;
  void *pvVar38;
  undefined1 (*pauVar39) [16];
  int i;
  long lVar40;
  undefined8 unaff_R12;
  long lVar41;
  ulong uVar42;
  undefined8 *puVar43;
  int iVar44;
  long lVar45;
  ulong uVar46;
  long lVar47;
  int iVar48;
  undefined1 (*pauVar49) [16];
  long lVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [32];
  float fVar92;
  __m128i _vindex_1;
  undefined1 auVar93 [32];
  __m128i _vindex;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar96 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  undefined1 auVar99 [32];
  undefined1 auVar100 [64];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  int TILE_N;
  int TILE_K;
  Mat m;
  int TILE_K_1;
  int TILE_M;
  undefined8 *local_258;
  long local_248;
  long local_230;
  undefined1 local_228 [16];
  long local_210;
  uint local_1f4;
  long local_1f0;
  ulong local_1e8;
  int local_1dc;
  undefined1 local_1d8 [44];
  int iStack_1ac;
  undefined8 uStack_1a8;
  int local_1a0;
  size_t local_198;
  ulong local_188;
  ulong local_180;
  long local_178;
  ulong local_170;
  Mat local_168;
  undefined8 local_118;
  long local_110;
  ulong local_108;
  uint local_fc;
  Mat *local_f8;
  undefined8 local_f0;
  long local_e8;
  undefined8 local_e0;
  Mat local_d8;
  Option *local_88;
  long local_80;
  undefined8 local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  uint local_54;
  long local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  uVar46._0_4_ = (this->super_Convolution).kernel_w;
  uVar46._4_4_ = (this->super_Convolution).kernel_h;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar46;
  auVar110 = vpshufd_avx(auVar52,0x55);
  local_228 = vpmulld_avx(auVar110,auVar52);
  uVar17 = local_228._0_4_;
  uVar23 = CONCAT44((int)((ulong)unaff_R12 >> 0x20),uVar17);
  uVar19 = (this->super_Convolution).num_output;
  uVar26 = (long)(this->super_Convolution).weight_data_size / (long)(int)uVar17;
  uVar25 = (ulong)(int)uVar19;
  uVar26 = (long)((ulong)(uint)((int)uVar26 >> 0x1f) << 0x20 | uVar26 & 0xffffffff) /
           (long)(int)uVar19;
  _h = (uint)uVar26;
  uVar30 = uVar26 & 0xffffffff;
  if ((opt->use_winograd23_convolution == false) && (opt->use_winograd43_convolution != true)) {
    bVar13 = false;
  }
  else {
    bVar13 = 8 < (int)uVar19 || 8 < (int)_h;
  }
  auVar110._0_4_ = (this->super_Convolution).dilation_w;
  auVar110._4_4_ = (this->super_Convolution).dilation_h;
  auVar110._8_4_ = (this->super_Convolution).stride_w;
  auVar110._12_4_ = (this->super_Convolution).stride_h;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar46;
  auVar110 = vpunpcklqdq_avx(auVar51,auVar110);
  local_f8 = &(this->super_Convolution).weight_data;
  local_88 = opt;
  if ((((auVar110 == _DAT_005f3440) && ((this->super_Convolution).stride_w == 1)) &&
      ((this->super_Convolution).stride_h == 1)) &&
     ((opt->use_winograd_convolution != false && (bVar13)))) {
    if (opt->use_winograd43_convolution == true) {
      get_optimal_tile_mnk_int8
                (uVar19,0,_h,(int *)&local_1f4,&local_1dc,(int *)&local_fc,opt->num_threads);
      uVar17 = local_fc;
      iVar29 = (int)((uVar19 - 1) + local_1f4) / (int)local_1f4;
      iVar48 = local_1f4 * local_fc;
      local_168.cstep = 0;
      local_168.data = (void *)0x0;
      local_168.refcount._0_4_ = 0;
      local_168.refcount._4_4_ = 0;
      local_168.elemsize = 0;
      local_168.elempack = 0;
      local_168.allocator = (Allocator *)0x0;
      local_168.dims = 0;
      local_168.w = 0;
      local_168.h = 0;
      local_168.d = 0;
      local_168.c = 0;
      Mat::create(&local_168,iVar48 * 0x24,1,opt->num_threads,4,(Allocator *)0x0);
      Mat::create(&this->weight_winograd43_data,iVar48,0x24,(int)(_h + uVar17 + -1) / (int)uVar17,
                  iVar29,4,(Allocator *)0x0);
      if (0 < iVar29) {
        iVar48 = 0;
        local_1f0 = CONCAT44(local_1f0._4_4_,iVar29);
        do {
          iVar29 = local_1f4 * iVar48;
          iVar14 = get_omp_thread_num();
          uVar17 = local_fc;
          local_1e8 = CONCAT44(local_1e8._4_4_,iVar48);
          psVar20 = (short *)((long)iVar14 * local_168.cstep * local_168.elemsize +
                             (long)local_168.data);
          local_1d8._8_4_ = 0;
          local_1d8._12_4_ = 0;
          local_1d8._16_8_ = local_168.elemsize;
          local_1d8._24_4_ = local_168.elempack;
          local_1d8._32_8_ = local_168.allocator;
          auVar11._4_4_ = (int)uStack_1a8;
          auVar11._8_4_ = uStack_1a8._4_4_;
          auVar11._0_4_ = local_168.w;
          stack0xfffffffffffffe50 = auVar11._0_8_ << 0x20;
          uStack_1a8._0_4_ = local_168.h;
          uStack_1a8._4_4_ = 1;
          local_1a0 = local_168.d;
          local_1d8._40_4_ = local_168.dims + -1;
          local_198 = (local_168.elemsize * (long)local_168.h * (long)local_168.w + 0xf &
                      0xfffffffffffffff0) / local_168.elemsize;
          if (local_168.dims == 4) {
            local_198 = (long)local_168.h * (long)local_168.w;
          }
          local_1d8._0_8_ = psVar20;
          if (0 < (int)_h) {
            uVar24 = uVar19 - iVar29;
            if ((int)local_1f4 < (int)(uVar19 - iVar29)) {
              uVar24 = local_1f4;
            }
            lVar45 = (long)(int)local_fc;
            iVar48 = iVar29 / (int)local_1f4;
            uVar46 = 0;
            do {
              uVar15 = _h - (int)uVar46;
              if ((int)uVar17 < (int)uVar15) {
                uVar15 = uVar17;
              }
              if (0 < (int)uVar24) {
                pvVar37 = local_f8->data;
                uVar26 = 0;
                psVar32 = psVar20;
                do {
                  if (0 < (int)uVar15) {
                    uVar25 = 0;
                    do {
                      pcVar36 = (char *)((long)pvVar37 +
                                        (uVar25 + uVar46) * 9 +
                                        (long)(int)((iVar29 + (int)uVar26) * _h * 9));
                      lVar40 = 0;
                      do {
                        cVar2 = *pcVar36;
                        cVar3 = pcVar36[1];
                        cVar4 = pcVar36[2];
                        *(short *)((long)&local_d8.data + lVar40 * 2) = cVar2 * 6;
                        *(short *)((long)&local_d8.data + lVar40 * 2 + 6) =
                             -(cVar4 * 4 + cVar3 * 4 + cVar2 * 4);
                        *(short *)((long)&local_d8.refcount + lVar40 * 2 + 4) =
                             cVar3 * 4 + cVar2 * -4 + cVar4 * -4;
                        *(short *)((long)&local_d8.elemsize + lVar40 * 2 + 2) =
                             (short)cVar2 + cVar3 * 2 + cVar4 * 4;
                        *(short *)((long)&local_d8.elempack + lVar40 * 2) =
                             ((short)cVar2 - ((short)cVar3 + (short)cVar3)) + cVar4 * 4;
                        *(short *)(&local_d8.field_0x1e + lVar40 * 2) = cVar4 * 6;
                        pcVar36 = pcVar36 + 3;
                        lVar40 = lVar40 + 1;
                      } while (lVar40 != 3);
                      lVar40 = 4;
                      do {
                        sVar5 = *(short *)((long)&local_e0 + lVar40 + 4);
                        sVar6 = *(short *)((long)&local_e0 + lVar40 + 6);
                        sVar7 = *(short *)((long)&local_d8.data + lVar40);
                        *psVar32 = sVar5 * 6;
                        psVar32[1] = -(sVar7 * 4 + sVar6 * 4 + sVar5 * 4);
                        psVar32[2] = sVar6 * 4 + sVar5 * -4 + sVar7 * -4;
                        psVar32[3] = sVar5 + sVar6 * 2 + sVar7 * 4;
                        psVar32[4] = sVar5 + sVar6 * -2 + sVar7 * 4;
                        psVar32[5] = sVar7 * 6;
                        psVar32 = psVar32 + 6;
                        lVar40 = lVar40 + 6;
                      } while (lVar40 != 0x28);
                      uVar25 = uVar25 + 1;
                    } while (uVar25 != uVar15);
                  }
                  uVar26 = uVar26 + 1;
                } while (uVar26 != uVar24);
              }
              local_d8.w = (this->weight_winograd43_data).w;
              local_d8.elemsize = (this->weight_winograd43_data).elemsize;
              local_d8.h = (this->weight_winograd43_data).h;
              local_d8.elempack = (this->weight_winograd43_data).elempack;
              local_d8.allocator = (this->weight_winograd43_data).allocator;
              local_d8.cstep = (long)local_d8.h * (long)local_d8.w;
              local_d8.data =
                   (void *)((long)(this->weight_winograd43_data).data +
                           local_d8.elemsize * local_d8.cstep *
                           (long)(int)((long)((ulong)(uint)((int)uVar46 >> 0x1f) << 0x20 |
                                             uVar46 & 0xffffffff) / (long)(int)uVar17) +
                           (this->weight_winograd43_data).cstep * (long)iVar48 * local_d8.elemsize);
              local_d8.refcount._0_4_ = 0;
              local_d8.refcount._4_4_ = 0;
              local_d8.dims = 2;
              local_d8.d = 1;
              local_d8.c = 1;
              pack_A_tile_int8((Mat *)local_1d8,&local_d8,0x24,uVar24,uVar15);
              local_d8.cstep = 0;
              local_d8.data._0_4_ = 0;
              local_d8.data._4_4_ = 0;
              local_d8.refcount._0_4_ = 0;
              local_d8.refcount._4_4_ = 0;
              local_d8.elemsize = 0;
              local_d8.elempack = 0;
              local_d8.dims = 0;
              local_d8.w = 0;
              local_d8.h = 0;
              local_d8.d = 0;
              local_d8.c = 0;
              uVar46 = uVar46 + lVar45;
            } while ((long)uVar46 < (long)(int)_h);
          }
          piVar9 = (int *)CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
          iVar29 = (int)local_1f0;
          iVar48 = (int)local_1e8;
          if (piVar9 != (int *)0x0) {
            LOCK();
            *piVar9 = *piVar9 + -1;
            UNLOCK();
            if (*piVar9 == 0) {
              if ((Allocator *)local_1d8._32_8_ == (Allocator *)0x0) {
                if ((short *)local_1d8._0_8_ != (short *)0x0) {
                  free((void *)local_1d8._0_8_);
                }
              }
              else {
                (*(*(_func_int ***)local_1d8._32_8_)[3])();
              }
            }
          }
          local_198 = 0;
          local_1d8._0_8_ = (void *)0x0;
          local_1d8._8_4_ = 0;
          local_1d8._12_4_ = 0;
          local_1d8._16_8_ = 0;
          local_1d8._24_4_ = 0;
          stack0xfffffffffffffe50 = (undefined1  [16])0x0;
          local_1a0 = 0;
          iVar48 = iVar48 + 1;
        } while (iVar48 != iVar29);
      }
      piVar9 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if (local_168.allocator != (Allocator *)0x0) {
            (*(local_168.allocator)->_vptr_Allocator[3])();
            goto LAB_00185b86;
          }
LAB_00185b79:
          if (local_168.data != (void *)0x0) {
            free(local_168.data);
          }
        }
      }
    }
    else {
      get_optimal_tile_mnk_int8
                (uVar19,0,_h,(int *)&local_1f4,&local_1dc,(int *)&local_fc,opt->num_threads);
      uVar17 = local_fc;
      iVar48 = (int)((uVar19 - 1) + local_1f4) / (int)local_1f4;
      iVar29 = local_1f4 * local_fc;
      local_168.cstep = 0;
      local_168.data = (void *)0x0;
      local_168.refcount._0_4_ = 0;
      local_168.refcount._4_4_ = 0;
      local_168.elemsize = 0;
      local_168.elempack = 0;
      local_168.allocator = (Allocator *)0x0;
      local_168.dims = 0;
      local_168.w = 0;
      local_168.h = 0;
      local_168.d = 0;
      local_168.c = 0;
      Mat::create(&local_168,iVar29 * 0x10,1,opt->num_threads,2,(Allocator *)0x0);
      Mat::create(&this->weight_winograd23_data,iVar29,0x10,(int)(_h + uVar17 + -1) / (int)uVar17,
                  iVar48,2,(Allocator *)0x0);
      if (0 < iVar48) {
        iVar29 = 0;
        do {
          iVar14 = local_1f4 * iVar29;
          iVar16 = get_omp_thread_num();
          uVar17 = local_fc;
          psVar20 = (short *)((long)iVar16 * local_168.cstep * local_168.elemsize +
                             (long)local_168.data);
          local_1d8._8_4_ = 0;
          local_1d8._12_4_ = 0;
          local_1d8._16_8_ = local_168.elemsize;
          local_1d8._24_4_ = local_168.elempack;
          local_1d8._32_8_ = local_168.allocator;
          auVar12._4_4_ = (int)uStack_1a8;
          auVar12._8_4_ = uStack_1a8._4_4_;
          auVar12._0_4_ = local_168.w;
          stack0xfffffffffffffe50 = auVar12._0_8_ << 0x20;
          uStack_1a8._0_4_ = local_168.h;
          uStack_1a8._4_4_ = 1;
          local_1a0 = local_168.d;
          local_1d8._40_4_ = local_168.dims + -1;
          local_198 = (local_168.elemsize * (long)local_168.h * (long)local_168.w + 0xf &
                      0xfffffffffffffff0) / local_168.elemsize;
          if (local_168.dims == 4) {
            local_198 = (long)local_168.h * (long)local_168.w;
          }
          local_1d8._0_8_ = psVar20;
          if (0 < (int)_h) {
            uVar24 = uVar19 - iVar14;
            if ((int)local_1f4 < (int)(uVar19 - iVar14)) {
              uVar24 = local_1f4;
            }
            lVar45 = (long)(int)local_fc;
            iVar16 = iVar14 / (int)local_1f4;
            uVar46 = 0;
            do {
              uVar15 = _h - (int)uVar46;
              if ((int)uVar17 < (int)uVar15) {
                uVar15 = uVar17;
              }
              if (0 < (int)uVar24) {
                pvVar37 = local_f8->data;
                uVar26 = 0;
                psVar32 = psVar20;
                do {
                  if (0 < (int)uVar15) {
                    uVar25 = 0;
                    do {
                      pcVar36 = (char *)((long)pvVar37 +
                                        (uVar25 + uVar46) * 9 +
                                        (long)(int)((iVar14 + (int)uVar26) * _h * 9));
                      lVar40 = 0;
                      do {
                        cVar2 = *pcVar36;
                        cVar3 = pcVar36[1];
                        cVar4 = pcVar36[2];
                        *(short *)((long)&local_d8.data + lVar40 * 2) = cVar2 * 2;
                        *(short *)((long)&local_d8.data + lVar40 * 2 + 6) =
                             (short)cVar3 + (short)cVar2 + (short)cVar4;
                        *(short *)((long)&local_d8.refcount + lVar40 * 2 + 4) =
                             ((short)cVar2 - (short)cVar3) + (short)cVar4;
                        *(short *)((long)&local_d8.elemsize + lVar40 * 2 + 2) =
                             (short)cVar4 + (short)cVar4;
                        pcVar36 = pcVar36 + 3;
                        lVar40 = lVar40 + 1;
                      } while (lVar40 != 3);
                      lVar40 = 4;
                      do {
                        sVar5 = *(short *)((long)&local_e0 + lVar40 + 4);
                        sVar6 = *(short *)((long)&local_e0 + lVar40 + 6);
                        sVar7 = *(short *)((long)&local_d8.data + lVar40);
                        *psVar32 = sVar5 * 2;
                        psVar32[1] = sVar6 + sVar5 + sVar7;
                        psVar32[2] = (sVar5 - sVar6) + sVar7;
                        psVar32[3] = sVar7 * 2;
                        psVar32 = psVar32 + 4;
                        lVar40 = lVar40 + 6;
                      } while (lVar40 != 0x1c);
                      uVar25 = uVar25 + 1;
                    } while (uVar25 != uVar15);
                  }
                  uVar26 = uVar26 + 1;
                } while (uVar26 != uVar24);
              }
              local_d8.w = (this->weight_winograd23_data).w;
              local_d8.elemsize = (this->weight_winograd23_data).elemsize;
              local_d8.h = (this->weight_winograd23_data).h;
              local_d8.elempack = (this->weight_winograd23_data).elempack;
              local_d8.allocator = (this->weight_winograd23_data).allocator;
              local_d8.cstep = (long)local_d8.h * (long)local_d8.w;
              local_d8.data =
                   (void *)((long)(this->weight_winograd23_data).data +
                           local_d8.elemsize * local_d8.cstep *
                           (long)(int)((long)((ulong)(uint)((int)uVar46 >> 0x1f) << 0x20 |
                                             uVar46 & 0xffffffff) / (long)(int)uVar17) +
                           (this->weight_winograd23_data).cstep * (long)iVar16 * local_d8.elemsize);
              local_d8.refcount._0_4_ = 0;
              local_d8.refcount._4_4_ = 0;
              local_d8.dims = 2;
              local_d8.d = 1;
              local_d8.c = 1;
              pack_A_tile_int8((Mat *)local_1d8,&local_d8,0x10,uVar24,uVar15);
              local_d8.cstep = 0;
              local_d8.data._0_4_ = 0;
              local_d8.data._4_4_ = 0;
              local_d8.refcount._0_4_ = 0;
              local_d8.refcount._4_4_ = 0;
              local_d8.elemsize = 0;
              local_d8.elempack = 0;
              local_d8.dims = 0;
              local_d8.w = 0;
              local_d8.h = 0;
              local_d8.d = 0;
              local_d8.c = 0;
              uVar46 = uVar46 + lVar45;
            } while ((long)uVar46 < (long)(int)_h);
          }
          piVar9 = (int *)CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
          if (piVar9 != (int *)0x0) {
            LOCK();
            *piVar9 = *piVar9 + -1;
            UNLOCK();
            if (*piVar9 == 0) {
              if ((Allocator *)local_1d8._32_8_ == (Allocator *)0x0) {
                if ((short *)local_1d8._0_8_ != (short *)0x0) {
                  free((void *)local_1d8._0_8_);
                }
              }
              else {
                (*(*(_func_int ***)local_1d8._32_8_)[3])();
              }
            }
          }
          local_198 = 0;
          local_1d8._0_8_ = (void *)0x0;
          local_1d8._8_4_ = 0;
          local_1d8._12_4_ = 0;
          local_1d8._16_8_ = 0;
          local_1d8._24_4_ = 0;
          stack0xfffffffffffffe50 = (undefined1  [16])0x0;
          local_1a0 = 0;
          iVar29 = iVar29 + 1;
        } while (iVar29 != iVar48);
      }
      piVar9 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if (local_168.allocator == (Allocator *)0x0) goto LAB_00185b79;
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    local_118 = uVar23;
    if (opt->use_sgemm_convolution != true) {
      uVar24 = _h;
      if ((int)uVar19 < 0x10) {
        if (7 < (int)uVar19) {
          if (0xf < (int)_h) {
            uVar24 = (_h & 1) + (int)(uVar30 >> 4) + (uint)((_h >> 3 & 1) != 0) +
                     ((uint)(uVar30 >> 1) & 3);
            uVar15 = (uVar19 & 1) + 1 + (uVar19 >> 2 & 1) + (uint)((uVar19 >> 1 & 1) != 0);
            goto LAB_00185531;
          }
          if (7 < (int)_h) {
            uVar24 = (_h & 1) + ((uint)(uVar30 >> 1) & 3) + 1;
            uVar15 = (uVar19 & 1) + 1 + ((uint)(uVar25 >> 2) & 1) + (uint)((uVar19 >> 1 & 1) != 0);
            goto LAB_001855cd;
          }
          if (1 < (int)_h) {
            uVar24 = _h - (int)(uVar30 >> 1);
            uVar15 = (uVar19 & 1) + 1 + (uVar19 >> 2 & 1) + (uint)((uVar19 >> 1 & 1) != 0);
            goto LAB_00185d20;
          }
          uVar15 = (uVar19 & 1) + 1 + ((uint)(uVar25 >> 2) & 1) + (uint)((uVar19 >> 1 & 1) != 0);
LAB_00185dd0:
          sVar33 = 8;
          iVar29 = 8;
          goto LAB_00185eb4;
        }
        if (3 < (int)uVar19) {
          if ((int)_h < 0x10) {
            if (7 < (int)_h) {
              uVar24 = (_h & 1) + ((uint)(uVar30 >> 1) & 3) + 1;
              uVar15 = (uVar19 & 1) + 1 + (uint)((uVar19 >> 1 & 1) != 0);
              goto LAB_00185696;
            }
            if (1 < (int)_h) {
              sVar33 = 8;
              iVar29 = 8;
              uVar24 = _h - (int)(uVar30 >> 1);
              uVar15 = (uVar19 & 1) + 1 + (uint)((uVar19 >> 1 & 1) != 0);
              goto LAB_00185e87;
            }
            sVar33 = 4;
            iVar29 = 4;
            uVar15 = (uVar19 & 1) + 1 + (uint)((uVar19 >> 1 & 1) != 0);
          }
          else {
            uVar24 = (_h & 1) + (int)(uVar30 >> 4) + (uint)((_h >> 3 & 1) != 0) +
                     ((uint)(uVar30 >> 1) & 3);
            uVar15 = (uVar19 & 1) + 1 + (uint)((uVar19 >> 1 & 1) != 0);
LAB_001855cd:
            sVar33 = 0x40;
            iVar29 = 0x40;
          }
          goto LAB_00185eb4;
        }
        if ((int)uVar19 < 2) {
          if (0xf < (int)_h) {
            uVar24 = (_h & 1) + (int)(uVar30 >> 4) + (uint)((_h >> 3 & 1) != 0) +
                     ((uint)(uVar30 >> 1) & 3);
            sVar33 = 0x10;
            iVar29 = 0x10;
            uVar15 = uVar19;
            goto LAB_00185e87;
          }
          uVar15 = uVar19;
          if (7 < (int)_h) {
            uVar24 = (_h & 1) + ((uint)(uVar30 >> 1) & 3) + 1;
            goto LAB_00185dd0;
          }
          if ((int)_h < 2) {
            sVar33 = 1;
            iVar29 = 1;
          }
          else {
            sVar33 = 2;
            iVar29 = 2;
            uVar24 = _h - (int)(uVar30 >> 1);
          }
          goto LAB_00185eb4;
        }
        if (0xf < (int)_h) {
          uVar24 = (_h & 1) + (int)(uVar30 >> 4) + (uint)((_h >> 3 & 1) != 0) +
                   ((uint)(uVar30 >> 1) & 3);
          uVar15 = (uVar19 & 1) + 1;
LAB_00185696:
          sVar33 = 0x20;
          iVar29 = 0x20;
          goto LAB_00185eb4;
        }
        if (7 < (int)_h) {
          uVar24 = (_h & 1) + ((uint)(uVar30 >> 1) & 3) + 1;
          uVar15 = (uVar19 & 1) + 1;
          goto LAB_00185d20;
        }
        if ((int)_h < 2) {
          sVar33 = 2;
          iVar29 = 2;
          uVar15 = (uVar19 & 1) + 1;
        }
        else {
          sVar33 = 4;
          iVar29 = 4;
          uVar24 = _h - (int)(uVar30 >> 1);
          uVar15 = (uVar19 & 1) + 1;
        }
LAB_00185e87:
        Mat::create(&this->weight_data_tm,uVar17,uVar24,uVar15,sVar33,iVar29,(Allocator *)0x0);
      }
      else {
        if ((int)_h < 0x10) {
          if ((int)_h < 8) {
            if (1 < (int)_h) {
              uVar24 = _h - (int)(uVar30 >> 1);
              uVar15 = (uVar19 & 1) + ((uint)(uVar25 >> 4) & 0xfffffff) +
                       (uint)((uVar19 >> 3 & 1) != 0) + ((uint)(uVar25 >> 2) & 1) +
                       (uint)((uVar19 >> 1 & 1) != 0);
              goto LAB_00185696;
            }
            uVar15 = (uVar19 & 1) + ((uint)(uVar25 >> 4) & 0xfffffff) +
                     (uint)((uVar19 >> 3 & 1) != 0) + (uVar19 >> 2 & 1) +
                     (uint)((uVar19 >> 1 & 1) != 0);
LAB_00185d20:
            sVar33 = 0x10;
            iVar29 = 0x10;
          }
          else {
            uVar24 = (_h & 1) + ((uint)(uVar26 >> 1) & 3) + 1;
            uVar15 = (uVar19 & 1) + (uVar19 >> 4) + (uint)((uVar19 >> 3 & 1) != 0) +
                     ((uint)(uVar25 >> 2) & 1) + (uint)((uVar19 >> 1 & 1) != 0);
LAB_00185531:
            sVar33 = 0x80;
            iVar29 = 0x80;
          }
        }
        else {
          sVar33 = 0x100;
          iVar29 = 0x100;
          uVar24 = (_h & 1) + ((uint)(uVar26 >> 4) & 0xfffffff) + (uint)((_h >> 3 & 1) != 0) +
                   ((uint)(uVar30 >> 1) & 3);
          uVar15 = (uVar19 & 1) + (uVar19 >> 4) + (uint)((uVar19 >> 3 & 1) != 0) +
                   ((uint)(uVar25 >> 2) & 1) + (uint)((uVar19 >> 1 & 1) != 0);
        }
LAB_00185eb4:
        Mat::create(&this->weight_data_tm,uVar17,uVar24,uVar15,sVar33,iVar29,(Allocator *)0x0);
      }
      uVar46 = 0;
      auVar74 = vpbroadcastd_avx512f(ZEXT416(uVar17));
      auVar110 = ZEXT416(uVar17);
      uVar30 = (ulong)uVar17;
      auVar96 = auVar74._0_32_;
      if (0xf < (int)uVar19) {
        uVar24 = _h * uVar17;
        local_68 = (ulong)uVar24;
        auVar75 = vpmovsxbd_avx512f(_DAT_005f39c0);
        vpmulld_avx512f(auVar74,auVar75);
        local_e8 = (long)(int)(uVar17 << 4);
        auVar71 = vpmulld_avx512vl(auVar96,auVar75._0_32_);
        in_ZMM2 = ZEXT3264(auVar71);
        local_f0 = (ulong)(int)(uVar17 * 8);
        auVar76 = vpbroadcastd_avx512f();
        auVar52 = vpunpckldq_avx(auVar76._0_16_,ZEXT416(uVar24 + uVar17));
        auVar51 = vshufps_avx512vl(auVar110,auVar52,0x41);
        auVar52 = vpbroadcastd_avx512vl();
        auVar52 = vpaddd_avx(auVar52,auVar51);
        auVar98 = ZEXT1664(auVar52);
        auVar72._0_16_ = ZEXT116(0) * auVar52 + ZEXT116(1) * auVar51;
        auVar72._16_16_ = ZEXT116(1) * auVar52;
        auVar71 = vpbroadcastd_avx512vl();
        auVar71 = vpaddd_avx2(auVar71,auVar72);
        auVar100 = ZEXT3264(auVar71);
        auVar77 = vinserti32x4_avx512f(ZEXT1664(auVar51),auVar52,1);
        vinserti64x4_avx512f(auVar77,auVar71,1);
        local_70 = (long)(int)(uVar17 * 2);
        vpmulld_avx512f(auVar76,auVar75);
        local_78 = CONCAT44(local_78._4_4_,_h) & 0xfffffffffffffff0;
        uVar46 = 0;
        do {
          local_60 = uVar46;
          pvVar37 = (this->super_Convolution).weight_data.data;
          uVar17 = (uint)local_60;
          local_230 = (long)(int)(uVar24 * uVar17) + (long)pvVar37;
          local_108 = (long)(int)((uVar17 | 1) * uVar24) + (long)pvVar37;
          lVar45 = (long)(int)((uVar17 | 2) * uVar24) + (long)pvVar37;
          lVar21 = (long)(int)((uVar17 | 3) * uVar24) + (long)pvVar37;
          uVar28 = (long)(int)((uVar17 | 4) * uVar24) + (long)pvVar37;
          lVar47 = (long)(int)((uVar17 | 5) * uVar24) + (long)pvVar37;
          lVar27 = (long)(int)((uVar17 | 6) * uVar24) + (long)pvVar37;
          lVar41 = (long)(int)((uVar17 | 7) * uVar24) + (long)pvVar37;
          uVar34 = (long)(int)((uVar17 | 8) * uVar24) + (long)pvVar37;
          lVar31 = (long)(int)((uVar17 | 9) * uVar24) + (long)pvVar37;
          uVar46 = (long)(int)((uVar17 | 10) * uVar24) + (long)pvVar37;
          lVar40 = (long)(int)((uVar17 | 0xb) * uVar24) + (long)pvVar37;
          local_1e8 = (long)(int)((uVar17 | 0xc) * uVar24) + (long)pvVar37;
          local_1f0 = (long)(int)((uVar17 | 0xd) * uVar24) + (long)pvVar37;
          local_178 = (long)(int)((uVar17 | 0xe) * uVar24) + (long)pvVar37;
          local_180 = (long)(int)((uVar17 | 0xf) * uVar24) + (long)pvVar37;
          pauVar49 = (undefined1 (*) [16])
                     ((local_60 >> 4) * (this->weight_data_tm).cstep *
                      (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          if ((int)_h < 0x10) {
            local_188 = 0;
            uVar46 = local_68;
          }
          else {
            iVar29 = 0;
            do {
              local_170 = uVar34;
              local_228._0_8_ = lVar40;
              if (0 < (int)local_118) {
                uVar34 = 0;
                do {
                  auVar75 = vpgatherdd_avx512f(*(undefined4 *)(local_230 + uVar34 + local_170));
                  auVar100 = vpgatherdd_avx512f(*(undefined4 *)(local_108 + uVar34 + local_170));
                  auVar77 = vpgatherdd_avx512f(*(undefined4 *)(lVar45 + uVar34 + local_170));
                  auVar78 = vpgatherdd_avx512f(*(undefined4 *)(lVar21 + uVar34 + local_170));
                  auVar79 = vpgatherdd_avx512f(*(undefined4 *)(uVar28 + uVar34 + local_170));
                  auVar80 = vpgatherdd_avx512f(*(undefined4 *)(lVar47 + uVar34 + local_170));
                  auVar81 = vpgatherdd_avx512f(*(undefined4 *)(lVar27 + uVar34 + local_170));
                  auVar82 = vpgatherdd_avx512f(*(undefined4 *)(lVar41 + uVar34 + local_170));
                  auVar83 = vpgatherdd_avx512f(*(undefined4 *)(local_170 * 2 + uVar34));
                  auVar84 = vpgatherdd_avx512f(*(undefined4 *)(lVar31 + uVar34 + local_170));
                  auVar85 = vpgatherdd_avx512f(*(undefined4 *)(uVar46 + uVar34 + local_170));
                  auVar86 = vpgatherdd_avx512f(*(undefined4 *)(lVar40 + uVar34 + local_170));
                  vpxord_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
                  auVar87 = vpgatherdd_avx512f(*(undefined4 *)(local_1e8 + uVar34 + local_170));
                  vpxord_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
                  auVar88 = vpgatherdd_avx512f(*(undefined4 *)(local_1f0 + uVar34 + local_170));
                  vpxord_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
                  auVar89 = vpgatherdd_avx512f(*(undefined4 *)(local_178 + uVar34 + local_170));
                  vpxord_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
                  auVar90 = vpgatherdd_avx512f(*(undefined4 *)(local_180 + uVar34 + local_170));
                  auVar52 = vpmovdb_avx512f(auVar75);
                  auVar51 = vpmovdb_avx512f(auVar100);
                  auVar53 = vpmovdb_avx512f(auVar77);
                  auVar54 = vpmovdb_avx512f(auVar78);
                  auVar55 = vpmovdb_avx512f(auVar79);
                  auVar56 = vpmovdb_avx512f(auVar80);
                  auVar57 = vpmovdb_avx512f(auVar81);
                  auVar58 = vpmovdb_avx512f(auVar82);
                  auVar59 = vpmovdb_avx512f(auVar83);
                  auVar60 = vpmovdb_avx512f(auVar84);
                  auVar61 = vpmovdb_avx512f(auVar85);
                  auVar62 = vpmovdb_avx512f(auVar86);
                  auVar63 = vpmovdb_avx512f(auVar87);
                  auVar64 = vpmovdb_avx512f(auVar88);
                  auVar65 = vpmovdb_avx512f(auVar89);
                  auVar66 = vpmovdb_avx512f(auVar90);
                  auVar67 = vpunpcklwd_avx512vl(auVar52,auVar51);
                  auVar52 = vpunpckhwd_avx(auVar52,auVar51);
                  auVar70 = vpunpcklwd_avx(auVar53,auVar54);
                  auVar51 = vpunpckhwd_avx(auVar53,auVar54);
                  auVar69 = vpunpcklwd_avx(auVar55,auVar56);
                  auVar53 = vpunpckhwd_avx(auVar55,auVar56);
                  auVar68 = vpunpcklwd_avx(auVar57,auVar58);
                  auVar54 = vpunpckhwd_avx(auVar57,auVar58);
                  auVar57 = vpunpcklwd_avx(auVar59,auVar60);
                  auVar55 = vpunpckhwd_avx(auVar59,auVar60);
                  auVar58 = vpunpcklwd_avx(auVar61,auVar62);
                  auVar56 = vpunpckhwd_avx(auVar61,auVar62);
                  auVar59 = vpunpcklwd_avx512vl(auVar63,auVar64);
                  auVar60 = vpunpckhwd_avx512vl(auVar63,auVar64);
                  auVar61 = vpunpcklwd_avx512vl(auVar65,auVar66);
                  auVar62 = vpunpckhwd_avx512vl(auVar65,auVar66);
                  auVar63 = vpunpckldq_avx512vl(auVar67,auVar70);
                  auVar64 = vpunpckhdq_avx512vl(auVar67,auVar70);
                  auVar65 = vpunpckldq_avx512vl(auVar52,auVar51);
                  auVar52 = vpunpckhdq_avx(auVar52,auVar51);
                  auVar70 = vpunpckldq_avx(auVar69,auVar68);
                  auVar51 = vpunpckhdq_avx(auVar69,auVar68);
                  auVar69 = vpunpckldq_avx(auVar53,auVar54);
                  auVar53 = vpunpckhdq_avx(auVar53,auVar54);
                  auVar68 = vpunpckldq_avx(auVar57,auVar58);
                  auVar54 = vpunpckhdq_avx(auVar57,auVar58);
                  auVar57 = vpunpckldq_avx(auVar55,auVar56);
                  auVar55 = vpunpckhdq_avx(auVar55,auVar56);
                  auVar56 = vpunpckldq_avx512vl(auVar59,auVar61);
                  auVar58 = vpunpckhdq_avx512vl(auVar59,auVar61);
                  auVar59 = vpunpckldq_avx512vl(auVar60,auVar62);
                  auVar60 = vpunpckhdq_avx512vl(auVar60,auVar62);
                  in_ZMM18 = ZEXT1664(auVar60);
                  auVar61 = vpunpcklqdq_avx512vl(auVar63,auVar70);
                  in_ZMM20 = ZEXT1664(auVar61);
                  auVar62 = vpunpcklqdq_avx512vl(auVar68,auVar56);
                  auVar63 = vpunpckhqdq_avx512vl(auVar63,auVar70);
                  auVar56 = vpunpckhqdq_avx(auVar68,auVar56);
                  auVar70 = vpunpcklqdq_avx(auVar64,auVar51);
                  auVar68 = vpunpcklqdq_avx512vl(auVar54,auVar58);
                  in_ZMM21 = ZEXT1664(auVar68);
                  auVar51 = vpunpckhqdq_avx(auVar64,auVar51);
                  auVar54 = vpunpckhqdq_avx(auVar54,auVar58);
                  auVar58 = vpunpcklqdq_avx512vl(auVar65,auVar69);
                  auVar64 = vpunpcklqdq_avx512vl(auVar57,auVar59);
                  auVar69 = vpunpckhqdq_avx512vl(auVar65,auVar69);
                  auVar57 = vpunpckhqdq_avx512vl(auVar57,auVar59);
                  auVar59 = vpunpcklqdq_avx512vl(auVar52,auVar53);
                  in_ZMM19 = ZEXT1664(auVar59);
                  auVar65 = vpunpcklqdq_avx512vl(auVar55,auVar60);
                  auVar53 = vpunpckhqdq_avx(auVar52,auVar53);
                  auVar75 = ZEXT1664(auVar53);
                  auVar55 = vpunpckhqdq_avx512vl(auVar55,auVar60);
                  auVar100 = ZEXT1664(auVar55);
                  auVar52 = vmovdqu64_avx512vl(auVar61);
                  *pauVar49 = auVar52;
                  auVar52 = vmovdqu64_avx512vl(auVar62);
                  pauVar49[1] = auVar52;
                  pauVar49[2] = auVar63;
                  pauVar49[3] = auVar56;
                  pauVar49[4] = auVar70;
                  auVar52 = vmovdqu64_avx512vl(auVar68);
                  pauVar49[5] = auVar52;
                  pauVar49[6] = auVar51;
                  pauVar49[7] = auVar54;
                  pauVar49[8] = auVar58;
                  pauVar49[9] = auVar64;
                  pauVar49[10] = auVar69;
                  pauVar49[0xb] = auVar57;
                  auVar52 = vmovdqu64_avx512vl(auVar59);
                  pauVar49[0xc] = auVar52;
                  auVar52 = vmovdqu64_avx512vl(auVar65);
                  pauVar49[0xd] = auVar52;
                  pauVar49[0xe] = auVar53;
                  pauVar49[0xf] = auVar55;
                  pauVar49 = pauVar49 + 0x10;
                  uVar34 = uVar34 + 1;
                } while (uVar30 != uVar34);
              }
              local_230 = local_230 + local_e8;
              local_108 = local_108 + local_e8;
              lVar45 = lVar45 + local_e8;
              lVar21 = lVar21 + local_e8;
              uVar28 = uVar28 + local_e8;
              lVar47 = lVar47 + local_e8;
              lVar27 = lVar27 + local_e8;
              lVar41 = lVar41 + local_e8;
              uVar34 = local_170 + local_e8;
              lVar31 = lVar31 + local_e8;
              uVar46 = uVar46 + local_e8;
              lVar40 = lVar40 + local_e8;
              local_1e8 = local_1e8 + local_e8;
              local_1f0 = local_1f0 + local_e8;
              local_178 = local_178 + local_e8;
              local_180 = local_180 + local_e8;
              iVar48 = iVar29 + 0x1f;
              iVar29 = iVar29 + 0x10;
            } while (iVar48 < (int)_h);
            local_188 = uVar26 & 0xfffffff0;
            local_110 = lVar45;
            local_e0 = uVar28;
          }
          uVar17 = (uint)local_188 | 7;
          while (uVar28 = uVar34, uVar15 = (uint)local_188, (int)uVar17 < (int)_h) {
            local_228._0_8_ = lVar40;
            if (0 < (int)local_118) {
              uVar46 = 0;
              do {
                auVar71 = vpcmpeqd_avx2(auVar75._0_32_,auVar75._0_32_);
                auVar71 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar72 = vmovdqa64_avx512vl(auVar71);
                auVar71 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
                auVar101 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
                auVar102 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
                auVar103 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
                auVar104 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
                auVar71 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar73 = vmovdqa64_avx512vl(auVar71);
                in_ZMM19 = ZEXT3264(auVar73);
                auVar71 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
                auVar105 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
                auVar106 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
                auVar107 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
                auVar109 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
                auVar93 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2(auVar76._0_32_,auVar76._0_32_);
                auVar91 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2(auVar98._0_32_,auVar98._0_32_);
                auVar99 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar94 = in_ZMM2._0_32_;
                auVar71 = vpcmpeqd_avx2(auVar94,auVar94);
                auVar97 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
                auVar95 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2(auVar100._0_32_,auVar100._0_32_);
                auVar71 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar52 = vpmovdb_avx512vl(auVar72);
                auVar51 = vpmovdb_avx512vl(auVar101);
                auVar53 = vpmovdb_avx512vl(auVar102);
                auVar54 = vpmovdb_avx512vl(auVar103);
                auVar55 = vpmovdb_avx512vl(auVar104);
                auVar56 = vpmovdb_avx512vl(auVar73);
                in_ZMM18 = ZEXT864(auVar56._0_8_);
                auVar70 = vpmovdb_avx512vl(auVar105);
                auVar69 = vpmovdb_avx512vl(auVar106);
                auVar68 = vpmovdb_avx512vl(auVar107);
                auVar57 = vpmovdb_avx512vl(auVar109);
                auVar58 = vpmovdb_avx512vl(auVar93);
                auVar59 = vpmovdb_avx512vl(auVar91);
                auVar60 = vpmovdb_avx512vl(auVar99);
                auVar61 = vpmovdb_avx512vl(auVar97);
                auVar62._8_8_ = 0;
                auVar62._0_8_ = auVar52._0_8_;
                auVar63._8_8_ = 0;
                auVar63._0_8_ = auVar51._0_8_;
                auVar52 = vpunpcklwd_avx(auVar62,auVar63);
                auVar64._8_8_ = 0;
                auVar64._0_8_ = auVar53._0_8_;
                auVar53._8_8_ = 0;
                auVar53._0_8_ = auVar54._0_8_;
                auVar51 = vpunpcklwd_avx(auVar64,auVar53);
                auVar54._8_8_ = 0;
                auVar54._0_8_ = auVar55._0_8_;
                auVar111._8_8_ = 0;
                auVar111._0_8_ = auVar56._0_8_;
                auVar62 = vpunpcklwd_avx512vl(auVar54,auVar111);
                auVar65._8_8_ = 0;
                auVar65._0_8_ = auVar70._0_8_;
                auVar66._8_8_ = 0;
                auVar66._0_8_ = auVar69._0_8_;
                auVar53 = vpunpcklwd_avx(auVar65,auVar66);
                auVar67._8_8_ = 0;
                auVar67._0_8_ = auVar68._0_8_;
                auVar108._8_8_ = 0;
                auVar108._0_8_ = auVar57._0_8_;
                auVar54 = vpunpcklwd_avx(auVar67,auVar108);
                auVar55._8_8_ = 0;
                auVar55._0_8_ = auVar59._0_8_;
                auVar56._8_8_ = 0;
                auVar56._0_8_ = auVar58._0_8_;
                auVar55 = vpunpcklwd_avx(auVar56,auVar55);
                auVar69._8_8_ = 0;
                auVar69._0_8_ = auVar61._0_8_;
                auVar57._8_8_ = 0;
                auVar57._0_8_ = auVar60._0_8_;
                auVar56 = vpunpcklwd_avx(auVar57,auVar69);
                auVar70 = vpmovdb_avx512vl(auVar95);
                auVar69 = vpmovdb_avx512vl(auVar71);
                auVar68._8_8_ = 0;
                auVar68._0_8_ = auVar70._0_8_;
                auVar70._8_8_ = 0;
                auVar70._0_8_ = auVar69._0_8_;
                auVar70 = vpunpcklwd_avx(auVar68,auVar70);
                auVar69 = vpunpckldq_avx(auVar52,auVar51);
                auVar52 = vpunpckhdq_avx(auVar52,auVar51);
                auVar68 = vpunpckldq_avx(auVar54,auVar55);
                auVar51 = vpunpckhdq_avx(auVar54,auVar55);
                auVar55 = vpunpckldq_avx(auVar62,auVar53);
                auVar53 = vpunpckhdq_avx(auVar62,auVar53);
                auVar57 = vpunpckldq_avx(auVar56,auVar70);
                auVar54 = vpunpckhdq_avx(auVar56,auVar70);
                auVar56 = vpunpcklqdq_avx(auVar69,auVar55);
                auVar55 = vpunpckhqdq_avx(auVar69,auVar55);
                in_ZMM3 = ZEXT1664(auVar55);
                auVar70 = vpunpcklqdq_avx(auVar52,auVar53);
                auVar100 = ZEXT1664(auVar70);
                auVar52 = vpunpckhqdq_avx(auVar52,auVar53);
                auVar98 = ZEXT1664(auVar52);
                auVar69 = vpunpcklqdq_avx(auVar68,auVar57);
                auVar53 = vpunpckhqdq_avx(auVar68,auVar57);
                auVar76 = ZEXT1664(auVar53);
                auVar68 = vpunpcklqdq_avx(auVar51,auVar54);
                auVar51 = vpunpckhqdq_avx(auVar51,auVar54);
                auVar75 = ZEXT1664(auVar51);
                *pauVar49 = auVar56;
                in_ZMM2 = ZEXT3264(auVar94);
                pauVar49[1] = auVar69;
                pauVar49[2] = auVar55;
                pauVar49[3] = auVar53;
                pauVar49[4] = auVar70;
                pauVar49[5] = auVar68;
                pauVar49[6] = auVar52;
                pauVar49[7] = auVar51;
                pauVar49 = pauVar49 + 8;
                uVar46 = uVar46 + 1;
              } while (uVar30 != uVar46);
            }
            local_230 = local_230 + local_f0;
            local_108 = local_108 + local_f0;
            lVar45 = lVar45 + local_f0;
            uVar46 = uVar28 + local_f0;
            lVar40 = lVar40 + local_f0;
            local_1e8 = local_1e8 + local_f0;
            local_1f0 = local_1f0 + local_f0;
            local_178 = local_178 + local_f0;
            local_180 = local_180 + local_f0;
            local_188 = (ulong)(uVar15 + 8);
            uVar34 = uVar46;
            local_170 = uVar28;
            local_110 = lVar45;
            uVar17 = uVar15 + 0xf;
          }
          uVar15 = uVar15 | 1;
          uVar34 = local_188;
          while (iVar29 = (int)uVar34, (int)uVar15 < (int)_h) {
            if (0 < (int)local_118) {
              uVar34 = 0;
              do {
                auVar75 = vpgatherdd_avx512f(*(undefined4 *)(local_230 + uVar34 + uVar28));
                auVar77 = vpgatherdd_avx512f(*(undefined4 *)(uVar28 * 2 + uVar34));
                auVar52 = vpmovdb_avx512f(auVar75);
                *pauVar49 = auVar52;
                auVar52 = vpmovdb_avx512f(auVar77);
                pauVar49[1] = auVar52;
                pauVar49 = pauVar49 + 2;
                uVar34 = uVar34 + 1;
              } while (uVar30 != uVar34);
            }
            local_230 = local_230 + local_70;
            uVar28 = uVar28 + local_70;
            uVar34 = (ulong)(iVar29 + 2);
            uVar15 = iVar29 + 3;
          }
          if (iVar29 < (int)_h) {
            do {
              lVar45 = local_230;
              uVar28 = uVar30;
              if (0 < (int)local_118) {
                do {
                  auVar75 = vpgatherdd_avx512f(*(undefined4 *)(lVar45 + uVar46));
                  auVar52 = vpmovdb_avx512f(auVar75);
                  *pauVar49 = auVar52;
                  pauVar49 = pauVar49 + 1;
                  lVar45 = lVar45 + 1;
                  uVar28 = uVar28 - 1;
                } while (uVar28 != 0);
              }
              uVar17 = (int)uVar34 + 1;
              uVar34 = (ulong)uVar17;
            } while (uVar17 != _h);
          }
          uVar46 = local_60 + 0x10;
          uVar23 = local_118;
        } while (local_60 + 0x1f < (ulong)uVar19);
      }
      uVar17 = (uint)uVar46 | 7;
      iVar29 = (int)uVar23;
      local_80 = (long)iVar29;
      if ((int)uVar17 < (int)uVar19) {
        uVar24 = _h * iVar29;
        local_48 = (ulong)uVar24;
        auVar75 = vpmovsxbd_avx512f(_DAT_005f39c0);
        in_ZMM2 = vpmulld_avx512f(auVar74,auVar75);
        local_50 = (long)(iVar29 << 4);
        local_38 = (long)(iVar29 * 8);
        auVar72 = vpbroadcastd_avx512vl();
        auVar52 = vpunpckldq_avx(auVar72._0_16_,ZEXT416(uVar24 + iVar29));
        auVar51 = vshufps_avx512vl(auVar110,auVar52,0x41);
        auVar52 = vpbroadcastd_avx512vl();
        auVar52 = vpaddd_avx(auVar52,auVar51);
        auVar73._0_16_ = ZEXT116(0) * auVar52 + ZEXT116(1) * auVar51;
        auVar73._16_16_ = ZEXT116(1) * auVar52;
        auVar71 = vpbroadcastd_avx512vl();
        auVar71 = vpaddd_avx2(auVar71,auVar73);
        auVar98 = vinserti32x4_avx512f(ZEXT1664(auVar51),auVar52,1);
        vinserti64x4_avx512f(auVar98,auVar71,1);
        vpmulld_avx2(auVar72,auVar75._0_32_);
        local_54 = _h & 0xfffffff0;
        uVar46 = uVar46 & 0xffffffff;
        do {
          local_40 = uVar46;
          pvVar37 = (this->super_Convolution).weight_data.data;
          uVar15 = (uint)local_40;
          lVar47 = (long)(int)(uVar24 * uVar15) + (long)pvVar37;
          uVar34 = (long)(int)((uVar15 + 1) * uVar24) + (long)pvVar37;
          lVar31 = (long)(int)((uVar15 + 2) * uVar24) + (long)pvVar37;
          lVar40 = (long)(int)((uVar15 + 3) * uVar24) + (long)pvVar37;
          lVar21 = (long)(int)((uVar15 + 4) * uVar24) + (long)pvVar37;
          lVar41 = (long)(int)((uVar15 + 5) * uVar24) + (long)pvVar37;
          lVar27 = (long)(int)((uVar15 + 6) * uVar24) + (long)pvVar37;
          uVar28 = (long)(int)(uVar17 * uVar24) + (long)pvVar37;
          pauVar49 = (undefined1 (*) [16])
                     ((ulong)((uVar15 >> 4) + (uint)((uVar15 >> 3 & 1) != 0)) *
                      (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize +
                     (long)(this->weight_data_tm).data);
          uVar46 = 0;
          lVar45 = lVar40;
          if (0xf < (int)_h) {
            do {
              if (0 < (int)uVar23) {
                uVar22 = 0;
                do {
                  auVar75 = vpgatherdd_avx512f(*(undefined4 *)(lVar47 + uVar22 + uVar46));
                  auVar52 = vpmovdb_avx512f(auVar75);
                  auVar75 = vpgatherdd_avx512f(*(undefined4 *)(uVar34 + uVar22 + uVar46));
                  auVar51 = vpmovdb_avx512f(auVar75);
                  auVar75 = vpgatherdd_avx512f(*(undefined4 *)(lVar31 + uVar22 + uVar46));
                  auVar53 = vpmovdb_avx512f(auVar75);
                  auVar75 = vpgatherdd_avx512f(*(undefined4 *)(lVar45 + uVar22 + uVar46));
                  auVar54 = vpmovdb_avx512f(auVar75);
                  auVar75 = vpgatherdd_avx512f(*(undefined4 *)(lVar21 + uVar22 + uVar46));
                  auVar69 = vpmovdb_avx512f(auVar75);
                  auVar75 = vpgatherdd_avx512f(*(undefined4 *)(lVar41 + uVar22 + uVar46));
                  auVar68 = vpmovdb_avx512f(auVar75);
                  auVar75 = vpgatherdd_avx512f(*(undefined4 *)(lVar27 + uVar22 + uVar46));
                  auVar57 = vpmovdb_avx512f(auVar75);
                  auVar75 = vpgatherdd_avx512f(*(undefined4 *)(uVar28 + uVar22 + uVar46));
                  auVar58 = vpmovdb_avx512f(auVar75);
                  auVar55 = vpunpcklwd_avx(auVar52,auVar51);
                  auVar52 = vpunpckhwd_avx(auVar52,auVar51);
                  auVar56 = vpunpcklwd_avx(auVar53,auVar54);
                  auVar51 = vpunpckhwd_avx(auVar53,auVar54);
                  auVar70 = vpunpcklwd_avx(auVar69,auVar68);
                  auVar53 = vpunpckhwd_avx(auVar69,auVar68);
                  auVar69 = vpunpcklwd_avx(auVar57,auVar58);
                  auVar54 = vpunpckhwd_avx(auVar57,auVar58);
                  auVar68 = vpunpckldq_avx(auVar55,auVar56);
                  auVar55 = vpunpckhdq_avx(auVar55,auVar56);
                  auVar56 = vpunpckldq_avx(auVar52,auVar51);
                  auVar52 = vpunpckhdq_avx(auVar52,auVar51);
                  auVar57 = vpunpckldq_avx(auVar70,auVar69);
                  auVar51 = vpunpckhdq_avx(auVar70,auVar69);
                  auVar70 = vpunpckldq_avx(auVar53,auVar54);
                  auVar53 = vpunpckhdq_avx(auVar53,auVar54);
                  auVar69 = vpunpcklqdq_avx(auVar68,auVar57);
                  auVar54 = vpunpckhqdq_avx(auVar68,auVar57);
                  auVar68 = vpunpcklqdq_avx(auVar55,auVar51);
                  auVar51 = vpunpckhqdq_avx(auVar55,auVar51);
                  auVar57 = vpunpcklqdq_avx(auVar56,auVar70);
                  auVar55 = vpunpckhqdq_avx(auVar56,auVar70);
                  auVar56 = vpunpcklqdq_avx(auVar52,auVar53);
                  auVar52 = vpunpckhqdq_avx(auVar52,auVar53);
                  auVar75 = ZEXT1664(auVar52);
                  *pauVar49 = auVar69;
                  pauVar49[1] = auVar54;
                  pauVar49[2] = auVar68;
                  pauVar49[3] = auVar51;
                  pauVar49[4] = auVar57;
                  pauVar49[5] = auVar55;
                  pauVar49[6] = auVar56;
                  pauVar49[7] = auVar52;
                  pauVar49 = pauVar49 + 8;
                  uVar22 = uVar22 + 1;
                } while (uVar30 != uVar22);
              }
              lVar47 = lVar47 + local_50;
              uVar34 = uVar34 + local_50;
              lVar31 = lVar31 + local_50;
              lVar45 = lVar45 + local_50;
              lVar21 = lVar21 + local_50;
              lVar41 = lVar41 + local_50;
              lVar27 = lVar27 + local_50;
              uVar28 = uVar28 + local_50;
              iVar48 = (int)uVar46;
              uVar46 = (ulong)(iVar48 + 0x10);
            } while (iVar48 + 0x1f < (int)_h);
            uVar46 = (ulong)local_54;
          }
          uVar17 = (uint)uVar46;
          uVar22 = uVar34;
          lVar35 = lVar47;
          if ((int)(uVar17 | 7) < (int)_h) {
            local_108 = local_80 + uVar28;
            local_170 = lVar27 + local_80;
            local_110 = lVar41 + local_80;
            local_188 = lVar21 + local_80;
            local_e0 = lVar45 + local_80;
            local_e8 = lVar31 + local_80;
            local_f0 = uVar34 + local_80;
            local_60 = local_80 + lVar47;
            uVar22 = local_f0;
            uVar42 = 0;
            do {
              local_68 = uVar42;
              if (0 < (int)uVar23) {
                uVar22 = 0;
                uVar42 = local_68;
                do {
                  pauVar39 = pauVar49;
                  local_1e8 = uVar22;
                  uVar22 = uVar42;
                  lVar40 = 0;
                  do {
                    lVar50 = lVar40;
                    (*pauVar39)[lVar50] = *(undefined1 *)(lVar47 + uVar22);
                    (*pauVar39)[lVar50 + 1] = *(undefined1 *)(local_60 + uVar22);
                    (*pauVar39)[lVar50 + 2] = *(undefined1 *)(uVar34 + uVar22);
                    (*pauVar39)[lVar50 + 3] = *(undefined1 *)(local_f0 + uVar22);
                    (*pauVar39)[lVar50 + 4] = *(undefined1 *)(lVar31 + uVar22);
                    (*pauVar39)[lVar50 + 5] = *(undefined1 *)(local_e8 + uVar22);
                    (*pauVar39)[lVar50 + 6] = *(undefined1 *)(lVar45 + uVar22);
                    (*pauVar39)[lVar50 + 7] = *(undefined1 *)(local_e0 + uVar22);
                    (*pauVar39)[lVar50 + 8] = *(undefined1 *)(lVar21 + uVar22);
                    (*pauVar39)[lVar50 + 9] = *(undefined1 *)(local_188 + uVar22);
                    (*pauVar39)[lVar50 + 10] = *(undefined1 *)(lVar41 + uVar22);
                    (*pauVar39)[lVar50 + 0xb] = *(undefined1 *)(local_110 + uVar22);
                    (*pauVar39)[lVar50 + 0xc] = *(undefined1 *)(lVar27 + uVar22);
                    (*pauVar39)[lVar50 + 0xd] = *(undefined1 *)(local_170 + uVar22);
                    (*pauVar39)[lVar50 + 0xe] = *(undefined1 *)(uVar28 + uVar22);
                    (*pauVar39)[lVar50 + 0xf] = *(undefined1 *)(local_108 + uVar22);
                    uVar22 = uVar22 + (long)(iVar29 * 2);
                    lVar40 = lVar50 + 0x10;
                  } while ((int)(lVar50 + 0x10) != 0x40);
                  uVar42 = uVar42 + 1;
                  uVar22 = local_1e8 + 1;
                  pauVar49 = (undefined1 (*) [16])(pauVar39[1] + lVar50);
                } while (local_1e8 + 1 != uVar30);
                pauVar49 = (undefined1 (*) [16])(pauVar39[1] + lVar50);
                uVar23 = local_118;
                uVar22 = local_108;
                local_78 = uVar46;
                local_70 = lVar35;
              }
              lVar35 = lVar35 + local_38;
              iVar48 = (int)uVar46;
              uVar17 = iVar48 + 8;
              uVar46 = (ulong)uVar17;
              uVar42 = local_68 + local_38;
              local_1f0 = lVar31;
              local_180 = uVar28;
              local_178 = lVar27;
              lVar40 = lVar45;
            } while (iVar48 + 0xf < (int)_h);
          }
          local_228._0_8_ = lVar40;
          uVar15 = uVar17 | 1;
          while ((int)uVar15 < (int)_h) {
            if (0 < (int)uVar23) {
              uVar46 = 0;
              do {
                auVar75 = vpgatherdd_avx512f(*(undefined4 *)(lVar35 + uVar46 + uVar22));
                auVar52 = vpmovdb_avx512f(auVar75);
                *pauVar49 = auVar52;
                pauVar49 = pauVar49 + 1;
                uVar46 = uVar46 + 1;
              } while (uVar30 != uVar46);
            }
            lVar35 = lVar35 + iVar29 * 2;
            uVar15 = uVar17 + 3;
            uVar17 = uVar17 + 2;
          }
          if ((int)uVar17 < (int)_h) {
            do {
              uVar46 = uVar30;
              if (0 < (int)uVar23) {
                do {
                  auVar71 = vpcmpeqd_avx2(auVar75._0_32_,auVar75._0_32_);
                  auVar71 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                  auVar75 = ZEXT3264((undefined1  [32])0x0);
                  auVar52 = vpmovdb_avx512vl(auVar71);
                  *(long *)*pauVar49 = auVar52._0_8_;
                  pauVar49 = (undefined1 (*) [16])(*pauVar49 + 8);
                  uVar46 = uVar46 - 1;
                } while (uVar46 != 0);
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 != _h);
          }
          uVar46 = local_40 + 8;
          uVar17 = (uint)(local_40 + 0xf);
        } while ((long)(local_40 + 0xf) < (long)uVar25);
      }
      iVar29 = (int)uVar23;
      uVar24 = (uint)uVar46;
      uVar17 = uVar24 | 3;
      if ((int)uVar17 < (int)uVar19) {
        uVar15 = _h * iVar29;
        local_e0 = (ulong)uVar15;
        iVar48 = iVar29 * 2;
        local_1f0 = (long)(iVar29 << 4);
        local_178 = (long)(iVar29 * 8);
        auVar51 = vpbroadcastd_avx512vl();
        auVar52 = vpunpckldq_avx(auVar51,ZEXT416(uVar15 + iVar29));
        auVar52 = vshufps_avx512vl(auVar110,auVar52,0x41);
        auVar75 = ZEXT1664(auVar52);
        auVar53 = vpbroadcastd_avx512vl();
        vpaddd_avx(auVar53,auVar52);
        auVar52 = vpmulld_avx(auVar51,_DAT_005f3550);
        in_ZMM2 = ZEXT1664(auVar52);
        local_f0 = CONCAT44(local_f0._4_4_,_h) & 0xfffffffffffffff0;
        iVar16 = uVar15 * uVar17;
        iVar14 = uVar15 * 4;
        local_e8 = CONCAT44(local_e8._4_4_,iVar14);
        local_110 = CONCAT44(local_110._4_4_,(uVar24 + 2) * uVar15);
        local_188 = CONCAT44(local_188._4_4_,(uVar24 + 1) * uVar15);
        uVar24 = uVar24 * uVar15;
        uVar46 = uVar46 & 0xffffffff;
        do {
          local_170 = uVar46;
          local_180 = (ulong)uVar24;
          uVar18 = (uint)local_170;
          pvVar37 = (this->super_Convolution).weight_data.data;
          local_248 = (long)(int)(uVar15 * uVar18) + (long)pvVar37;
          local_210 = (long)(int)((uVar18 + 1) * uVar15) + (long)pvVar37;
          lVar45 = (long)(int)((uVar18 + 2) * uVar15) + (long)pvVar37;
          uVar46 = (long)(int)(uVar17 * uVar15) + (long)pvVar37;
          local_258 = (undefined8 *)
                      ((this->weight_data_tm).elemsize * (this->weight_data_tm).cstep *
                       (ulong)(((uint)(local_170 >> 3) & 1) + ((uint)(local_170 >> 4) & 0xfffffff) +
                              (uint)((uVar18 >> 2 & 1) != 0)) + (long)(this->weight_data_tm).data);
          local_108 = CONCAT44(local_108._4_4_,iVar16);
          if ((int)_h < 0x10) {
            uVar34 = 0;
          }
          else {
            local_230 = 0;
            iVar29 = 0;
            do {
              if (0 < (int)local_118) {
                auVar58._8_8_ = 0;
                auVar58._0_8_ = local_228._8_8_;
                local_228 = auVar58 << 0x40;
                lVar40 = local_230;
                do {
                  puVar43 = local_258;
                  lVar27 = 0;
                  lVar21 = lVar40;
                  do {
                    *(undefined1 *)((long)puVar43 + lVar27) =
                         *(undefined1 *)((long)pvVar37 + lVar21 + (int)uVar24);
                    *(undefined1 *)((long)puVar43 + lVar27 + 1) =
                         *(undefined1 *)((long)pvVar37 + lVar21 + (int)uVar24 + local_80);
                    *(undefined1 *)((long)puVar43 + lVar27 + 2) =
                         *(undefined1 *)((long)pvVar37 + lVar21 + (int)local_188);
                    *(undefined1 *)((long)puVar43 + lVar27 + 3) =
                         *(undefined1 *)((long)pvVar37 + lVar21 + (int)local_188 + local_80);
                    *(undefined1 *)((long)puVar43 + lVar27 + 4) =
                         *(undefined1 *)((long)pvVar37 + lVar21 + (int)local_110);
                    *(undefined1 *)((long)puVar43 + lVar27 + 5) =
                         *(undefined1 *)((long)pvVar37 + lVar21 + (int)local_110 + local_80);
                    *(undefined1 *)((long)puVar43 + lVar27 + 6) =
                         *(undefined1 *)((long)pvVar37 + lVar21 + iVar16);
                    *(undefined1 *)((long)puVar43 + lVar27 + 7) =
                         *(undefined1 *)((long)pvVar37 + lVar21 + iVar16 + local_80);
                    lVar27 = lVar27 + 8;
                    lVar21 = lVar21 + iVar48;
                  } while ((int)lVar27 != 0x40);
                  uVar34 = local_228._0_8_ + 1;
                  lVar40 = lVar40 + 1;
                  local_228._0_8_ = uVar34;
                  local_258 = (undefined8 *)((long)puVar43 + lVar27);
                } while (uVar34 != uVar30);
                local_258 = (undefined8 *)((long)puVar43 + lVar27);
                local_1e8 = uVar46;
              }
              local_248 = local_248 + local_1f0;
              local_210 = local_210 + local_1f0;
              lVar45 = lVar45 + local_1f0;
              uVar46 = uVar46 + local_1f0;
              iVar44 = iVar29 + 0x1f;
              local_230 = local_230 + local_1f0;
              iVar29 = iVar29 + 0x10;
            } while (iVar44 < (int)_h);
            uVar34 = uVar26 & 0xfffffff0;
            uVar23 = local_118;
          }
          uVar17 = (uint)uVar34;
          if ((int)(uVar17 | 7) < (int)_h) {
            lVar21 = 0;
            lVar40 = local_248;
            do {
              if (0 < (int)uVar23) {
                local_228._0_8_ = lVar40;
                uVar28 = 0;
                lVar27 = lVar21;
                do {
                  puVar43 = local_258;
                  lVar47 = 0;
                  lVar31 = lVar27;
                  do {
                    *(undefined1 *)((long)puVar43 + lVar47) = *(undefined1 *)(local_248 + lVar31);
                    *(undefined1 *)((long)puVar43 + lVar47 + 1) =
                         *(undefined1 *)(local_248 + local_80 + lVar31);
                    *(undefined1 *)((long)puVar43 + lVar47 + 2) =
                         *(undefined1 *)(local_210 + lVar31);
                    *(undefined1 *)((long)puVar43 + lVar47 + 3) =
                         *(undefined1 *)(local_210 + local_80 + lVar31);
                    *(undefined1 *)((long)puVar43 + lVar47 + 4) = *(undefined1 *)(lVar45 + lVar31);
                    *(undefined1 *)((long)puVar43 + lVar47 + 5) =
                         *(undefined1 *)(lVar45 + local_80 + lVar31);
                    *(undefined1 *)((long)puVar43 + lVar47 + 6) = *(undefined1 *)(uVar46 + lVar31);
                    *(undefined1 *)((long)puVar43 + lVar47 + 7) =
                         *(undefined1 *)(local_80 + uVar46 + lVar31);
                    lVar47 = lVar47 + 8;
                    lVar31 = lVar31 + iVar48;
                  } while ((int)lVar47 != 0x20);
                  uVar28 = uVar28 + 1;
                  lVar27 = lVar27 + 1;
                  local_258 = (undefined8 *)((long)puVar43 + lVar47);
                } while (uVar28 != uVar30);
                local_258 = (undefined8 *)((long)puVar43 + lVar47);
                uVar23 = local_118;
              }
              lVar40 = lVar40 + local_178;
              iVar29 = (int)uVar34;
              uVar17 = iVar29 + 8;
              lVar21 = lVar21 + local_178;
              uVar34 = (ulong)uVar17;
            } while (iVar29 + 0xf < (int)_h);
          }
          iVar29 = (int)uVar23;
          uVar18 = uVar17 | 1;
          while ((int)uVar18 < (int)_h) {
            if (0 < iVar29) {
              uVar46 = 0;
              do {
                auVar71 = vpcmpeqd_avx2(auVar75._0_32_,auVar75._0_32_);
                auVar71 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar75 = ZEXT3264((undefined1  [32])0x0);
                auVar52 = vpmovdb_avx512vl(auVar71);
                *local_258 = auVar52._0_8_;
                local_258 = local_258 + 1;
                uVar46 = uVar46 + 1;
              } while (uVar30 != uVar46);
            }
            uVar18 = uVar17 + 3;
            uVar17 = uVar17 + 2;
          }
          if ((int)uVar17 < (int)_h) {
            do {
              uVar46 = uVar30;
              if (0 < iVar29) {
                do {
                  auVar52 = vpcmpeqd_avx(auVar75._0_16_,auVar75._0_16_);
                  auVar52 = vpgatherdd((undefined1  [16])0x0,auVar52);
                  auVar75 = ZEXT1664((undefined1  [16])0x0);
                  auVar52 = vpmovdb_avx512vl(auVar52);
                  *(int *)local_258 = auVar52._0_4_;
                  local_258 = (undefined8 *)((long)local_258 + 4);
                  uVar46 = uVar46 - 1;
                } while (uVar46 != 0);
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 != _h);
          }
          uVar17 = (uint)(local_170 + 7);
          iVar16 = iVar16 + iVar14;
          local_110 = CONCAT44(local_110._4_4_,(int)local_110 + iVar14);
          local_188 = CONCAT44(local_188._4_4_,(int)local_188 + iVar14);
          uVar24 = uVar24 + iVar14;
          uVar46 = local_170 + 4;
        } while ((long)(local_170 + 7) < (long)uVar25);
        uVar46 = local_170 + 4 & 0xffffffff;
      }
      uVar17 = (uint)uVar46 | 1;
      if ((int)uVar17 < (int)uVar19) {
        uVar24 = _h * iVar29;
        auVar75 = vpmovsxbd_avx512f(_DAT_005f39c0);
        in_ZMM2 = vpmulld_avx512f(auVar74,auVar75);
        auVar72 = vpmulld_avx512vl(auVar96,auVar75._0_32_);
        auVar73 = vpbroadcastd_avx512vl();
        auVar71 = vpaddd_avx2(auVar73,auVar72);
        vinserti64x4_avx512f(ZEXT3264(auVar72),auVar71,1);
        auVar110 = vpunpckldq_avx512vl(auVar110,ZEXT416(uVar24 + iVar29));
        auVar75 = ZEXT1664(auVar110);
        auVar59._0_4_ = auVar73._0_4_;
        auVar59._4_12_ = SUB6412(ZEXT1664((undefined1  [16])0x0),4);
        vshufps_avx(auVar59,auVar110,0x41);
        uVar26 = (long)(int)(uint)uVar46;
        do {
          uVar15 = (uint)uVar26;
          pvVar37 = (this->super_Convolution).weight_data.data;
          lVar40 = (long)(int)(uVar24 * uVar15) + (long)pvVar37;
          lVar45 = (long)(int)(uVar17 * uVar24) + (long)pvVar37;
          pauVar49 = (undefined1 (*) [16])
                     ((this->weight_data_tm).elemsize * (this->weight_data_tm).cstep *
                      (ulong)(((uint)(uVar26 >> 2) & 1) +
                              ((uint)(uVar26 >> 4) & 0xfffffff) + (uint)((uVar15 >> 3 & 1) != 0) +
                             (uint)((uVar15 >> 1 & 1) != 0)) + (long)(this->weight_data_tm).data);
          if ((int)_h < 0x10) {
            uVar17 = 0;
          }
          else {
            iVar48 = 0;
            do {
              if (0 < iVar29) {
                uVar46 = 0;
                do {
                  auVar75 = vpgatherdd_avx512f(*(undefined4 *)(lVar40 + uVar46 + (ulong)uVar24));
                  auVar98 = vpgatherdd_avx512f(*(undefined4 *)(lVar45 + uVar46 + (ulong)uVar24));
                  auVar110 = vpmovdb_avx512f(auVar75);
                  *pauVar49 = auVar110;
                  auVar110 = vpmovdb_avx512f(auVar98);
                  pauVar49[1] = auVar110;
                  pauVar49 = pauVar49 + 2;
                  uVar46 = uVar46 + 1;
                } while (uVar30 != uVar46);
              }
              lVar40 = lVar40 + (iVar29 << 4);
              lVar45 = lVar45 + (iVar29 << 4);
              iVar14 = iVar48 + 0x1f;
              iVar48 = iVar48 + 0x10;
              uVar17 = _h & 0xfffffff0;
            } while (iVar14 < (int)_h);
          }
          uVar15 = uVar17 | 7;
          while ((int)uVar15 < (int)_h) {
            if (0 < iVar29) {
              uVar46 = 0;
              do {
                auVar75 = vpgatherdd_avx512f(*(undefined4 *)(lVar40 + uVar46 + lVar45));
                auVar110 = vpmovdb_avx512f(auVar75);
                *pauVar49 = auVar110;
                pauVar49 = pauVar49 + 1;
                uVar46 = uVar46 + 1;
              } while (uVar30 != uVar46);
            }
            lVar40 = lVar40 + iVar29 * 8;
            lVar45 = lVar45 + iVar29 * 8;
            uVar15 = uVar17 + 0xf;
            uVar17 = uVar17 + 8;
          }
          uVar15 = uVar17 | 1;
          while ((int)uVar15 < (int)_h) {
            if (0 < iVar29) {
              uVar46 = 0;
              do {
                auVar110 = vpcmpeqd_avx(auVar75._0_16_,auVar75._0_16_);
                auVar110 = vpgatherdd((undefined1  [16])0x0,auVar110);
                auVar75 = ZEXT1664((undefined1  [16])0x0);
                auVar110 = vpmovdb_avx512vl(auVar110);
                *(int *)*pauVar49 = auVar110._0_4_;
                pauVar49 = (undefined1 (*) [16])((long)*pauVar49 + 4);
                uVar46 = uVar46 + 1;
              } while (uVar30 != uVar46);
            }
            lVar40 = lVar40 + iVar29 * 2;
            lVar45 = lVar45 + iVar29 * 2;
            uVar15 = uVar17 + 3;
            uVar17 = uVar17 + 2;
          }
          if ((int)uVar17 < (int)_h) {
            do {
              if (0 < iVar29) {
                uVar46 = 0;
                do {
                  (*pauVar49)[0] = *(undefined1 *)(lVar40 + uVar46);
                  *(undefined1 *)((long)*pauVar49 + 1) = *(undefined1 *)(lVar45 + uVar46);
                  pauVar49 = (undefined1 (*) [16])((long)*pauVar49 + 2);
                  uVar46 = uVar46 + 1;
                } while (uVar30 != uVar46);
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 != _h);
          }
          uVar46 = uVar26 + 2;
          lVar45 = uVar26 + 3;
          uVar17 = (uint)lVar45;
          uVar26 = uVar46;
        } while (lVar45 < (long)uVar25);
      }
      if ((int)uVar46 < (int)uVar19) {
        auVar75 = vpmovsxbd_avx512f(_DAT_005f39c0);
        vpmulld_avx512f(auVar74,auVar75);
        vpmulld_avx512vl(auVar96,auVar75._0_32_);
        uVar46 = (ulong)(int)uVar46;
        do {
          uVar19 = (uint)uVar46;
          lVar45 = (long)(int)(_h * iVar29 * uVar19) +
                   (long)(this->super_Convolution).weight_data.data;
          pauVar49 = (undefined1 (*) [16])
                     ((this->weight_data_tm).elemsize * (this->weight_data_tm).cstep *
                      (ulong)((uVar19 & 1) + ((uint)(uVar46 >> 4) & 0xfffffff) +
                              (uint)((uVar19 >> 3 & 1) != 0) + ((uint)(uVar46 >> 2) & 1) +
                             (uint)((uVar19 >> 1 & 1) != 0)) + (long)(this->weight_data_tm).data);
          if ((int)_h < 0x10) {
            uVar19 = 0;
          }
          else {
            iVar48 = 0;
            do {
              if (0 < iVar29) {
                uVar26 = 0;
                do {
                  in_ZMM2 = vpgatherdd_avx512f(*(undefined4 *)
                                                (lVar45 + uVar26 + (ulong)(_h * iVar29)));
                  auVar110 = vpmovdb_avx512f(in_ZMM2);
                  *pauVar49 = auVar110;
                  pauVar49 = pauVar49 + 1;
                  uVar26 = uVar26 + 1;
                } while (uVar30 != uVar26);
              }
              lVar45 = lVar45 + (iVar29 << 4);
              iVar14 = iVar48 + 0x1f;
              iVar48 = iVar48 + 0x10;
              uVar19 = _h & 0xfffffff0;
            } while (iVar14 < (int)_h);
          }
          uVar17 = uVar19 | 7;
          while ((int)uVar17 < (int)_h) {
            if (0 < iVar29) {
              uVar26 = 0;
              do {
                auVar96 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
                auVar96 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar96);
                in_ZMM2 = ZEXT3264((undefined1  [32])0x0);
                auVar110 = vpmovdb_avx512vl(auVar96);
                *(long *)*pauVar49 = auVar110._0_8_;
                pauVar49 = (undefined1 (*) [16])((long)*pauVar49 + 8);
                uVar26 = uVar26 + 1;
              } while (uVar30 != uVar26);
            }
            lVar45 = lVar45 + iVar29 * 8;
            uVar17 = uVar19 + 0xf;
            uVar19 = uVar19 + 8;
          }
          if ((int)(uVar19 | 1) < (int)_h) {
            lVar40 = lVar45 + local_80;
            uVar17 = uVar19;
            do {
              if (0 < iVar29) {
                uVar26 = 0;
                do {
                  (*pauVar49)[0] = *(undefined1 *)(lVar45 + uVar26);
                  *(undefined1 *)((long)*pauVar49 + 1) = *(undefined1 *)(lVar40 + uVar26);
                  pauVar49 = (undefined1 (*) [16])((long)*pauVar49 + 2);
                  uVar26 = uVar26 + 1;
                } while (uVar30 != uVar26);
              }
              lVar45 = lVar45 + iVar29 * 2;
              uVar19 = uVar17 + 2;
              iVar48 = uVar17 + 3;
              lVar40 = lVar40 + iVar29 * 2;
              uVar17 = uVar19;
            } while (iVar48 < (int)_h);
          }
          if ((int)uVar19 < (int)_h) {
            do {
              if (0 < iVar29) {
                uVar26 = 0;
                do {
                  *(undefined1 *)((long)*pauVar49 + uVar26) = *(undefined1 *)(lVar45 + uVar26);
                  uVar26 = uVar26 + 1;
                } while (uVar30 != uVar26);
                pauVar49 = (undefined1 (*) [16])((long)*pauVar49 + uVar26);
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != _h);
          }
          uVar46 = uVar46 + 1;
        } while (uVar46 != uVar25);
      }
      goto LAB_00185bbb;
    }
    iVar48 = _h * uVar17;
    convolution_im2col_gemm_get_optimal_tile_mnk_int8
              (uVar19,0,iVar48,(int *)&local_d8,(int *)&local_1f4,&local_1dc,opt->num_threads);
    iVar29 = (int)((int)local_d8.data + uVar19 + -1) / (int)local_d8.data;
    uVar24 = 8;
    if (opt->use_packing_layout == false) {
      uVar24 = 1;
    }
    if ((uVar26 & 7) != 0) {
      uVar24 = 1;
    }
    local_168.cstep = 0;
    local_168.data = (void *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.elemsize = 0;
    local_168.elempack = 0;
    local_168.allocator = (Allocator *)0x0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
    if (uVar17 == 1) {
      Mat::reshape((Mat *)local_1d8,local_f8,iVar48,uVar19,(Allocator *)0x0);
      piVar9 = (int *)CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + 1;
        UNLOCK();
      }
      piVar9 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if (local_168.allocator == (Allocator *)0x0) {
            if (local_168.data != (void *)0x0) {
              free(local_168.data);
            }
          }
          else {
            (*(local_168.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar9 = (int *)CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
      local_168.data = (void *)local_1d8._0_8_;
      local_168.refcount._0_4_ = local_1d8._8_4_;
      local_168.refcount._4_4_ = local_1d8._12_4_;
      local_168.elemsize = local_1d8._16_8_;
      local_168.elempack = local_1d8._24_4_;
      local_168.allocator = (Allocator *)local_1d8._32_8_;
      local_168.dims = local_1d8._40_4_;
      local_168.w = local_1d8._44_4_;
      local_168.h = local_1d8._48_4_;
      local_168.d = local_1d8._52_4_;
      local_168.c = local_1a0;
      local_168.cstep = local_198;
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if ((Allocator *)local_1d8._32_8_ == (Allocator *)0x0) {
            if ((void *)local_1d8._0_8_ != (void *)0x0) {
              free((void *)local_1d8._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_1d8._32_8_)[3])();
          }
        }
      }
      local_198 = 0;
      local_1d8._0_8_ = (void *)0x0;
      local_1d8._8_4_ = 0;
      local_1d8._12_4_ = 0;
      local_1d8._16_8_ = 0;
      local_1d8._24_4_ = 0;
      stack0xfffffffffffffe50 = (undefined1  [16])0x0;
      local_1a0 = 0;
    }
    else {
      Mat::reshape((Mat *)local_1d8,local_f8,uVar17,_h,uVar19,(Allocator *)0x0);
      Mat::create(&local_168,iVar48,uVar19,1,1,(Allocator *)0x0);
      if (0 < (int)uVar19) {
        uVar46 = 0;
        do {
          if ((int)uVar24 <= (int)_h) {
            pvVar37 = (void *)((long)local_168.w * uVar46 * local_168.elemsize +
                              (long)local_168.data);
            lVar45 = 0;
            do {
              if (0 < (int)uVar23) {
                uVar26 = 0;
                do {
                  pvVar38 = pvVar37;
                  uVar25 = 0;
                  do {
                    *(undefined1 *)((long)pvVar38 + uVar25) =
                         *(undefined1 *)
                          (local_1d8._0_8_ +
                          uVar26 + (lVar45 + uVar25) * (long)iStack_1ac * local_1d8._16_8_ +
                                   local_198 * uVar46 * local_1d8._16_8_);
                    uVar25 = uVar25 + 1;
                  } while (uVar24 != uVar25);
                  uVar26 = uVar26 + 1;
                  pvVar37 = (void *)((long)pvVar38 + uVar25);
                } while (uVar26 != uVar17);
                pvVar37 = (void *)((long)pvVar38 + uVar25);
                uVar23 = local_118;
              }
              lVar45 = lVar45 + (ulong)uVar24;
            } while (lVar45 < (long)((long)(int)_h - (ulong)(uVar24 - 1)));
          }
          uVar46 = uVar46 + 1;
        } while (uVar46 != uVar19);
      }
      piVar9 = (int *)CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if ((Allocator *)local_1d8._32_8_ == (Allocator *)0x0) {
            if ((void *)local_1d8._0_8_ != (void *)0x0) {
              free((void *)local_1d8._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_1d8._32_8_)[3])();
          }
        }
      }
    }
    iVar14 = local_1dc;
    if (local_1dc < 4) {
LAB_00185944:
      Mat::create(&this->weight_sgemm_data,(int)local_d8.data * iVar14,
                  (iVar48 + iVar14 + -1) / iVar14,
                  (int)((uVar19 - 1) + (int)local_d8.data) / (int)local_d8.data,1,1,(Allocator *)0x0
                 );
    }
    else {
      iVar16 = cpu_support_x86_avx512_vnni();
      bVar13 = true;
      if (iVar16 == 0) {
        iVar16 = cpu_support_x86_avx_vnni();
        bVar13 = iVar16 != 0;
      }
      iVar16 = cpu_support_x86_avx_vnni_int8();
      if (!(bool)(bVar13 & iVar16 == 0)) goto LAB_00185944;
      iVar16 = 0x40;
      if ((((int)local_d8.data < 0x10) && (iVar16 = 0x20, (int)local_d8.data < 8)) &&
         (iVar16 = 0x10, (int)local_d8.data < 4)) {
        iVar16 = (uint)(1 < (int)local_d8.data) * 4 + 4;
      }
      Mat::create(&this->weight_sgemm_data,(iVar16 + iVar14) * (int)local_d8.data,
                  (iVar48 + iVar14 + -1) / iVar14,
                  (int)((uVar19 - 1) + (int)local_d8.data) / (int)local_d8.data,1,1,(Allocator *)0x0
                 );
    }
    if (0 < iVar29) {
      iVar14 = 0;
      do {
        iVar44 = (int)local_d8.data * iVar14;
        iVar16 = uVar19 - iVar44;
        if ((int)local_d8.data < (int)(uVar19 - iVar44)) {
          iVar16 = (int)local_d8.data;
        }
        if (0 < iVar48) {
          k_00 = 0;
          do {
            max_kk = iVar48 - k_00;
            if (local_1dc < iVar48 - k_00) {
              max_kk = local_1dc;
            }
            iStack_1ac = (this->weight_sgemm_data).w;
            local_198 = (size_t)iStack_1ac;
            local_1d8._16_8_ = (this->weight_sgemm_data).elemsize;
            local_1d8._24_4_ = (this->weight_sgemm_data).elempack;
            local_1d8._32_8_ = (this->weight_sgemm_data).allocator;
            local_1d8._0_8_ =
                 (long)(this->weight_sgemm_data).data +
                 local_1d8._16_8_ * local_198 * (long)(k_00 / local_1dc) +
                 (long)(iVar44 / (int)local_d8.data) * (this->weight_sgemm_data).cstep *
                 local_1d8._16_8_;
            local_1d8._8_4_ = 0;
            local_1d8._12_4_ = 0;
            local_1d8._40_4_ = 2;
            uStack_1a8 = 0x100000001;
            local_1a0 = 1;
            Gemm_x86_avx512_utility::pack_A_tile_int8
                      (&local_168,(Mat *)local_1d8,iVar44,iVar16,k_00,max_kk);
            piVar9 = (int *)CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
            if (piVar9 != (int *)0x0) {
              LOCK();
              *piVar9 = *piVar9 + -1;
              UNLOCK();
              if (*piVar9 == 0) {
                if ((Allocator *)local_1d8._32_8_ == (Allocator *)0x0) {
                  if ((void *)local_1d8._0_8_ != (void *)0x0) {
                    free((void *)local_1d8._0_8_);
                  }
                }
                else {
                  (*(*(_func_int ***)local_1d8._32_8_)[3])();
                }
              }
            }
            local_198 = 0;
            local_1d8._0_8_ = (void *)0x0;
            local_1d8._8_4_ = 0;
            local_1d8._12_4_ = 0;
            local_1d8._16_8_ = 0;
            local_1d8._24_4_ = 0;
            stack0xfffffffffffffe50 = (undefined1  [16])0x0;
            local_1a0 = 0;
            k_00 = k_00 + local_1dc;
          } while (k_00 < iVar48);
        }
        iVar14 = iVar14 + 1;
      } while (iVar14 != iVar29);
    }
    piVar9 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        if (local_168.allocator == (Allocator *)0x0) goto LAB_00185b79;
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00185b86:
  local_168.cstep = 0;
  local_168.data = (void *)0x0;
  local_168.refcount._0_4_ = 0;
  local_168.refcount._4_4_ = 0;
  local_168.elemsize = 0;
  local_168.elempack = 0;
  local_168.dims = 0;
  local_168.w = 0;
  local_168.h = 0;
  local_168.d = 0;
  local_168.c = 0;
LAB_00185bbb:
  Mat::create(&this->scale_in_data,(this->super_Convolution).num_output,4,(Allocator *)0x0);
  lVar45 = (long)(this->super_Convolution).num_output;
  if (0 < lVar45) {
    pvVar37 = (this->super_Convolution).weight_data_int8_scales.data;
    pfVar8 = (float *)(this->super_Convolution).bottom_blob_int8_scales.data;
    pvVar38 = (this->scale_in_data).data;
    lVar40 = 0;
    do {
      fVar1 = *(float *)((long)pvVar37 + lVar40 * 4);
      fVar92 = 0.0;
      if (fVar1 != 0.0) {
        fVar92 = 1.0 / (fVar1 * *pfVar8);
      }
      *(float *)((long)pvVar38 + lVar40 * 4) = fVar92;
      lVar40 = lVar40 + 1;
    } while (lVar45 != lVar40);
  }
  if (local_88->lightmode != false) {
    piVar9 = (this->super_Convolution).weight_data.refcount;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        pvVar37 = (this->super_Convolution).weight_data.data;
        pAVar10 = (this->super_Convolution).weight_data.allocator;
        if (pAVar10 == (Allocator *)0x0) {
          if (pvVar37 != (void *)0x0) {
            free(pvVar37);
          }
        }
        else {
          (*pAVar10->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution).weight_data.cstep = 0;
    *(undefined8 *)((long)&local_f8->refcount + 4) = 0;
    *(undefined8 *)((long)&local_f8->elemsize + 4) = 0;
    local_f8->data = (void *)0x0;
    local_f8->refcount = (int *)0x0;
    (this->super_Convolution).weight_data.dims = 0;
    (this->super_Convolution).weight_data.w = 0;
    (this->super_Convolution).weight_data.h = 0;
    (this->super_Convolution).weight_data.d = 0;
    (this->super_Convolution).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_avx512::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (opt.use_winograd43_convolution)
            conv3x3s1_winograd43_transform_kernel_int8(weight_data, weight_winograd43_data, num_input, num_output, opt);
        else
            conv3x3s1_winograd23_transform_kernel_int8(weight_data, weight_winograd23_data, num_input, num_output, opt);
    }
    else if (opt.use_sgemm_convolution)
    {
        convolution_im2col_gemm_transform_kernel_int8(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h, opt);
    }
    else
    {
        convolution_transform_kernel_packed_int8(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // requantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}